

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void __thiscall rlist::_free(rlist *this,void *__ptr)

{
  void *ptr_local;
  rlist *this_local;
  
  *(undefined8 *)(*__ptr + 8) = *(undefined8 *)((long)__ptr + 8);
  **(undefined8 **)((long)__ptr + 8) = *__ptr;
  *(undefined8 *)((long)__ptr + 8) = 0;
  *(undefined8 *)__ptr = 0;
  if (__ptr != (void *)0x0) {
    operator_delete(__ptr);
  }
  return;
}

Assistant:

void rlist::_free(void *ptr){
    ((listNode *)ptr)->prev->next=((listNode *)ptr)->next;
    ((listNode *)ptr)->next->prev=((listNode *)ptr)->prev;
    ((listNode *)ptr)->next=nullptr;   
    ((listNode *)ptr)->prev=nullptr;   
    delete (listNode *)ptr;
}